

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,SourceBuffer *args)

{
  undefined8 *puVar1;
  size_type sVar2;
  ulong uVar3;
  size_t *psVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  size_t sVar8;
  BufferID BVar9;
  undefined4 uVar10;
  pointer pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  EVP_PKEY_CTX *pEVar15;
  EVP_PKEY_CTX *ctx;
  long lVar16;
  pointer pSVar17;
  
  pSVar17 = this->data_ + this->len;
  if (this->len != this->cap) {
    sVar5 = (args->data)._M_len;
    pcVar6 = (args->data)._M_str;
    BVar9.id = (args->id).id;
    uVar10 = *(undefined4 *)&args->field_0x1c;
    pSVar17->library = args->library;
    pSVar17->id = (BufferID)BVar9.id;
    *(undefined4 *)&pSVar17->field_0x1c = uVar10;
    (pSVar17->data)._M_len = sVar5;
    (pSVar17->data)._M_str = pcVar6;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar15 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar15 < ctx) {
    pEVar15 = ctx;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    pEVar15 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar16 = (long)pSVar17 - (long)this->data_;
  pSVar11 = (pointer)operator_new((long)pEVar15 << 5);
  sVar5 = (args->data)._M_len;
  pcVar6 = (args->data)._M_str;
  uVar7 = *(undefined8 *)&args->id;
  puVar1 = (undefined8 *)((long)pSVar11 + lVar16 + 0x10);
  *puVar1 = args->library;
  puVar1[1] = uVar7;
  *(size_t *)((long)pSVar11 + lVar16) = sVar5;
  ((size_t *)((long)pSVar11 + lVar16))[1] = (size_t)pcVar6;
  pSVar14 = this->data_;
  pSVar12 = pSVar14 + this->len;
  pSVar13 = pSVar11;
  if (pSVar12 == pSVar17) {
    for (; pSVar14 != pSVar17; pSVar14 = pSVar14 + 1) {
      sVar5 = (pSVar14->data)._M_len;
      pcVar6 = (pSVar14->data)._M_str;
      BVar9.id = (pSVar14->id).id;
      uVar10 = *(undefined4 *)&pSVar14->field_0x1c;
      pSVar13->library = pSVar14->library;
      pSVar13->id = (BufferID)BVar9.id;
      *(undefined4 *)&pSVar13->field_0x1c = uVar10;
      (pSVar13->data)._M_len = sVar5;
      (pSVar13->data)._M_str = pcVar6;
      pSVar13 = pSVar13 + 1;
    }
  }
  else {
    for (; pSVar14 != pSVar17; pSVar14 = pSVar14 + 1) {
      sVar5 = (pSVar14->data)._M_len;
      pcVar6 = (pSVar14->data)._M_str;
      BVar9.id = (pSVar14->id).id;
      uVar10 = *(undefined4 *)&pSVar14->field_0x1c;
      pSVar13->library = pSVar14->library;
      pSVar13->id = (BufferID)BVar9.id;
      *(undefined4 *)&pSVar13->field_0x1c = uVar10;
      (pSVar13->data)._M_len = sVar5;
      (pSVar13->data)._M_str = pcVar6;
      pSVar13 = pSVar13 + 1;
    }
    psVar4 = (size_t *)(lVar16 + (long)pSVar11);
    for (; pSVar17 != pSVar12; pSVar17 = pSVar17 + 1) {
      sVar5 = (pSVar17->data)._M_len;
      pcVar6 = (pSVar17->data)._M_str;
      sVar8 = *(size_t *)&pSVar17->id;
      psVar4[6] = (size_t)pSVar17->library;
      psVar4[7] = sVar8;
      psVar4[4] = sVar5;
      psVar4[5] = (size_t)pcVar6;
      psVar4 = psVar4 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar15;
  this->data_ = pSVar11;
  return (reference)((long)pSVar11 + lVar16);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }